

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data.cpp
# Opt level: O2

string * convert<float>(string *__return_storage_ptr__,float *x,size_t count,size_t stride)

{
  string local_50;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,"[",(allocator *)&local_50);
  while (count != 0) {
    std::__cxx11::to_string(&local_50,*x);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_50);
    if (count != 1) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    x = (float *)((long)x + stride);
    count = count - 1;
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string convert(T* x, size_t count, size_t stride)
{
    std::string result = "[";
    for (size_t i = 0; i < count; ++i)
    {
        result += std::to_string(*x);
        if (i != count - 1)
            result += ", ";

        x = (T*) ((char*) x + stride);      // this is horribly ugly, but technically correct
    }
    result += "]";
    return result;
}